

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

path_t * __thiscall CField::get_solution_abi_cxx11_(path_t *__return_storage_ptr__,CField *this)

{
  passed_t *this_00;
  pos_t *b;
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  iterator iVar5;
  _List_node_base *p_Var6;
  SState local_60;
  SState s;
  undefined1 local_48;
  undefined7 uStack_47;
  _List_node_base *p_Stack_40;
  _List_node_base *local_38;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  local_60.direction = EP_SOUTH;
  local_60.inverted = false;
  local_60.drunken = false;
  this_00 = &this->passed;
  b = &this->bender;
  local_38 = (_List_node_base *)__return_storage_ptr__;
  while( true ) {
    s = *(SState *)b;
    p_Var2 = (_List_node_base *)CONCAT26(local_60._6_2_,CONCAT24(local_60._4_2_,local_60.direction))
    ;
    iVar5 = std::
            _Rb_tree<std::pair<std::pair<int,_int>,_CField::SState>,_std::pair<std::pair<int,_int>,_CField::SState>,_std::_Identity<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::less<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::allocator<std::pair<std::pair<int,_int>,_CField::SState>_>_>
            ::find(&this_00->_M_t,(key_type *)&s);
    p_Var3 = local_38;
    if ((&(this->passed)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)iVar5._M_node) ||
       (((this->_exit).first == (this->bender).first &&
        ((this->_exit).second == (this->bender).second)))) break;
    s = *(SState *)b;
    std::
    _Rb_tree<std::pair<std::pair<int,int>,CField::SState>,std::pair<std::pair<int,int>,CField::SState>,std::_Identity<std::pair<std::pair<int,int>,CField::SState>>,std::less<std::pair<std::pair<int,int>,CField::SState>>,std::allocator<std::pair<std::pair<int,int>,CField::SState>>>
    ::_M_insert_unique<std::pair<std::pair<int,int>,CField::SState>>
              ((_Rb_tree<std::pair<std::pair<int,int>,CField::SState>,std::pair<std::pair<int,int>,CField::SState>,std::_Identity<std::pair<std::pair<int,int>,CField::SState>>,std::less<std::pair<std::pair<int,int>,CField::SState>>,std::allocator<std::pair<std::pair<int,int>,CField::SState>>>
                *)this_00,(key_type *)&s);
    bVar4 = step(this,b,&local_60,(path_t *)local_38);
    if (bVar4) {
      std::
      _Rb_tree<std::pair<std::pair<int,_int>,_CField::SState>,_std::pair<std::pair<int,_int>,_CField::SState>,_std::_Identity<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::less<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::allocator<std::pair<std::pair<int,_int>,_CField::SState>_>_>
      ::clear(&this_00->_M_t);
    }
  }
  if (((this->_exit).first != (this->bender).first) ||
     ((this->_exit).second != (this->bender).second)) {
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
    p_Var3->_M_prev = p_Var3;
    p_Var3->_M_next = p_Var3;
    p_Var3[1]._M_next = (_List_node_base *)0x0;
    s = (SState)&local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&s,"LOOP","");
    p_Var6 = (_List_node_base *)operator_new(0x30);
    p_Var3 = local_38;
    p_Var6[1]._M_next = p_Var6 + 2;
    if (s == (SState)&local_48) {
      p_Var6[2]._M_next = (_List_node_base *)CONCAT71(uStack_47,local_48);
      p_Var6[2]._M_prev = p_Stack_40;
    }
    else {
      p_Var6[1]._M_next = (_List_node_base *)s;
      p_Var6[2]._M_next = (_List_node_base *)CONCAT71(uStack_47,local_48);
    }
    p_Var6[1]._M_prev = p_Var2;
    local_48 = 0;
    s = (SState)&local_48;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&p_Var3->_M_next)->_M_impl)._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (s != (SState)&local_48) {
      operator_delete((void *)s,CONCAT71(uStack_47,local_48) + 1);
    }
  }
  return (path_t *)
         (_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_38;
}

Assistant:

path_t get_solution()
        {
            //dump_field();
            path_t result;
            SState s(EP_SOUTH, false, false);
            while (passed.end() == passed.find(cell_state_t(bender, s))
                && _exit != bender)
            {
                passed.insert(cell_state_t(bender, s));
                bool should_clear = step(bender, s, result);
                if (should_clear)
                {
                    passed.clear();
                }
            }
            if (_exit != bender)
            {
                result.clear();
                result.push_back("LOOP");
            }
            
            return result;
        }